

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

void fctkern__write_help(fctkern_t *nk,FILE *out)

{
  int iVar1;
  fct_clp_t *list;
  size_t sVar2;
  bool bVar3;
  long *local_58;
  fct_logger_types_t *itr;
  fct_logger_types_t *pfStack_48;
  int type_i;
  fct_logger_types_t *types [2];
  fctcl_t *clo;
  size_t num_itemsclo;
  size_t item_iclo;
  fct_clp_t *clp;
  FILE *out_local;
  fctkern_t *nk_local;
  
  list = &nk->cl_parser;
  fprintf((FILE *)out,"test.exe [options] prefix_filter ...\n\n");
  if (list != (fct_clp_t *)0x0) {
    sVar2 = fct_nlist__size(&list->clo_list);
    for (num_itemsclo = 0; num_itemsclo != sVar2; num_itemsclo = num_itemsclo + 1) {
      types[1] = (fct_logger_types_t *)fct_nlist__at(&list->clo_list,num_itemsclo);
      if (types[1]->logger_new_fn == (fct_logger_new_fn)0x0) {
        fprintf((FILE *)out,"%s\n",types[1]->name);
      }
      else {
        fprintf((FILE *)out,"%s, %s\n",types[1]->logger_new_fn,types[1]->name);
      }
      iVar1 = fctstr_ieq(types[1]->name,"--logger");
      if (iVar1 == 0) {
        fprintf((FILE *)out,"  %s\n",types[1][1].name);
      }
      else {
        pfStack_48 = nk->lt_sys;
        types[0] = nk->lt_usr;
        fputs("  Sets the logger. The types of loggers currently available are,\n",(FILE *)out);
        for (itr._4_4_ = 0; itr._4_4_ != 2; itr._4_4_ = itr._4_4_ + 1) {
          local_58 = *(long **)((long)&stack0xffffffffffffffb8 + (long)itr._4_4_ * 8);
          while( true ) {
            bVar3 = false;
            if (local_58 != (long *)0x0) {
              bVar3 = *local_58 != 0;
            }
            if (!bVar3) break;
            fprintf((FILE *)out,"   =%s : %s\n",*local_58,local_58[2]);
            local_58 = local_58 + 3;
          }
        }
        fprintf((FILE *)out,"  default is \'%s\'.\n","standard");
      }
    }
  }
  fputs("\n",(FILE *)out);
  return;
}

Assistant:

static void
fctkern__write_help(fctkern_t *nk, FILE *out)
{
    fct_clp_t *clp = &(nk->cl_parser);
    fprintf(out, "test.exe [options] prefix_filter ...\n\n");
    FCT_NLIST_FOREACH_BGN(fctcl_t*, clo, &(clp->clo_list))
    {
        if ( clo->short_opt != NULL )
        {
            fprintf(out, "%s, %s\n", clo->short_opt, clo->long_opt);
        }
        else
        {
            fprintf(out, "%s\n", clo->long_opt);
        }
        if ( !fctstr_ieq(clo->long_opt, FCT_OPT_LOGGER) )
        {
            /* For now lets not get to fancy with the text wrapping. */
            fprintf(out, "  %s\n", clo->help);
        }
        else
        {
            fct_logger_types_t *types[2];
            int type_i;
            fct_logger_types_t *itr;
            types[0] = nk->lt_sys;
            types[1] = nk->lt_usr;
            fputs("  Sets the logger. The types of loggers currently "
                  "available are,\n", out);
            for (type_i =0; type_i != 2; ++type_i )
            {
                for ( itr=types[type_i]; itr && itr->name != NULL; ++itr )
                {
                    fprintf(out, "   =%s : %s\n", itr->name, itr->desc);
                }
            }
            fprintf(out, "  default is '%s'.\n", FCT_DEFAULT_LOGGER);
        }
    }
    FCT_NLIST_FOREACH_END();
    fputs("\n", out);
}